

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall curlpp::FormParts::File::File(File *this,string *name,string *filename)

{
  FormPart::FormPart(&this->super_FormPart,name);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__File_00134bb0;
  std::__cxx11::string::string((string *)&this->mFilename,(string *)filename);
  (this->mContentType)._M_dataplus._M_p = (pointer)&(this->mContentType).field_2;
  (this->mContentType)._M_string_length = 0;
  (this->mContentType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

curlpp::FormParts::File::File(const std::string & name, 
			      const std::string & filename)
  : FormPart(name)
  , mFilename(filename)
{}